

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O3

Expression __thiscall
dynet::FastLSTMBuilder::add_input_impl(FastLSTMBuilder *this,int prev,Expression *x)

{
  undefined8 *puVar1;
  bool bVar2;
  pointer pvVar3;
  long lVar4;
  pointer pEVar5;
  pointer pvVar6;
  ulong uVar7;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *pvVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  Expression EVar12;
  Expression i_it;
  Expression i_crt;
  Expression in;
  Expression i_wt;
  Expression ph_t;
  Expression i_h_tm1;
  Expression i_ft;
  Expression i_ot;
  Expression local_188;
  Expression local_178;
  Expression local_168;
  ComputationGraph *local_158;
  pointer puStack_150;
  Expression local_148;
  FastLSTMBuilder *local_138;
  pointer local_130;
  Expression local_128;
  Expression local_118;
  pointer local_108;
  pointer pCStack_100;
  pointer local_f8;
  ulong local_f0;
  Expression local_e8;
  undefined1 local_d8 [16];
  pointer local_c8;
  pointer puStack_c0;
  ComputationGraph *local_b8;
  pointer puStack_b0;
  ExecutionEngine *local_a8;
  undefined8 uStack_a0;
  pointer local_98;
  pointer pCStack_90;
  Expression local_88;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *local_70;
  long local_68;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *local_60;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *local_58;
  Expression local_50;
  initializer_list<dynet::Expression> local_40;
  
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_d8,
             (ulong)this->layers,(allocator_type *)&local_158);
  local_58 = &this->h;
  std::
  vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
  ::emplace_back<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
            ((vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
              *)local_58,(vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_d8);
  if ((pointer)local_d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d8._0_8_);
  }
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_d8,
             (ulong)this->layers,(allocator_type *)&local_158);
  local_60 = &this->c;
  std::
  vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
  ::emplace_back<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
            ((vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
              *)local_60,(vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_d8);
  if ((pointer)local_d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d8._0_8_);
  }
  local_f8 = (this->h).
             super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_130 = (this->c).
              super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_158 = x->pg;
  puStack_150 = *(pointer *)&x->i;
  if (this->layers != 0) {
    local_70 = &this->c0;
    lVar9 = 0;
    local_68 = (ulong)(uint)prev << 3;
    lVar10 = 0;
    local_f0 = 0;
    local_138 = this;
    do {
      pvVar3 = (this->param_vars).
               super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_108 = (pointer)0x0;
      pCStack_100 = (pointer)0x0;
      local_88.pg = (ComputationGraph *)0x0;
      local_88.i = 0;
      local_88.graph_id = 0;
      bVar2 = this->has_initial_state;
      bVar11 = prev < 0;
      if (bVar11) {
        if ((bVar2 & 1U) != 0) {
          puVar1 = (undefined8 *)
                   ((long)&((local_138->h0).
                            super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->pg + lVar10);
          local_108 = (pointer)*puVar1;
          pCStack_100 = (pointer)puVar1[1];
          pvVar8 = local_70;
          goto LAB_00273ab6;
        }
      }
      else {
        puVar1 = (undefined8 *)
                 (*(long *)((long)&(((local_58->
                                     super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                   )._M_impl + local_68 * 3) + lVar10);
        local_108 = (pointer)*puVar1;
        pCStack_100 = (pointer)puVar1[1];
        pvVar8 = (vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                 ((long)&(((local_60->
                           super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                         _M_impl + local_68 * 3);
LAB_00273ab6:
        puVar1 = (undefined8 *)
                 ((long)&((pvVar8->
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)
                          ._M_impl.super__Vector_impl_data._M_start)->pg + lVar10);
        local_88.pg = (ComputationGraph *)*puVar1;
        local_88._8_8_ = puVar1[1];
      }
      local_118 = (Expression)ZEXT816(0);
      if (bVar11 && (bVar2 & 1U) == 0) {
        local_d8 = *(undefined1 (*) [16])
                    (*(long *)((long)&(pvVar3->
                                      super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                      )._M_impl.super__Vector_impl_data + lVar9) + 0x30);
        puVar1 = *(undefined8 **)
                  ((long)&(pvVar3->
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)
                          ._M_impl.super__Vector_impl_data + lVar9);
        local_c8 = (pointer)*puVar1;
        puStack_c0 = (pointer)puVar1[1];
        local_b8 = local_158;
        puStack_b0 = puStack_150;
        local_188.i = 3;
        local_188.graph_id = 0;
        local_188.pg = (ComputationGraph *)local_d8;
        local_118 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                              ((initializer_list<dynet::Expression> *)&local_188);
      }
      else {
        local_d8 = *(undefined1 (*) [16])
                    (*(long *)((long)&(pvVar3->
                                      super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                      )._M_impl.super__Vector_impl_data + lVar9) + 0x30);
        puVar1 = *(undefined8 **)
                  ((long)&(pvVar3->
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)
                          ._M_impl.super__Vector_impl_data + lVar9);
        local_c8 = (pointer)*puVar1;
        puStack_c0 = (pointer)puVar1[1];
        local_b8 = local_158;
        puStack_b0 = puStack_150;
        lVar4 = *(long *)((long)&(pvVar3->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar9);
        local_a8 = *(ExecutionEngine **)(lVar4 + 0x10);
        uStack_a0 = *(undefined8 *)(lVar4 + 0x18);
        local_98 = local_108;
        pCStack_90 = pCStack_100;
        local_e8.i = 5;
        local_e8.graph_id = 0;
        local_e8.pg = (ComputationGraph *)local_d8;
        local_188 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                              ((initializer_list<dynet::Expression> *)&local_e8);
        local_168 = cmult((Expression *)
                          (*(long *)((long)&(pvVar3->
                                            super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                            )._M_impl.super__Vector_impl_data + lVar9) + 0x20),
                          &local_88);
        local_118 = operator+(&local_188,&local_168);
      }
      local_188 = logistic(&local_118);
      local_e8 = operator-(1.0,&local_188);
      local_168 = (Expression)ZEXT816(0);
      local_148.pg = (ComputationGraph *)local_d8;
      if (bVar11 && (bVar2 & 1U) == 0) {
        lVar4 = *(long *)((long)&(pvVar3->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar9);
        local_d8._0_8_ = *(undefined8 *)(lVar4 + 0xa0);
        local_d8._8_8_ = *(undefined8 *)(lVar4 + 0xa8);
        lVar4 = *(long *)((long)&(pvVar3->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar9);
        local_c8 = *(pointer *)(lVar4 + 0x80);
        puStack_c0 = *(pointer *)(lVar4 + 0x88);
        local_b8 = local_158;
        puStack_b0 = puStack_150;
        local_148.i = 3;
        local_148.graph_id = 0;
        local_168 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                              ((initializer_list<dynet::Expression> *)&local_148);
        tanh((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        EVar12 = cmult(&local_188,&local_148);
        pEVar5 = local_130[-1].
                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(ComputationGraph **)((long)&pEVar5->pg + lVar10) = EVar12.pg;
        *(long *)((long)&pEVar5->i + lVar10) = EVar12._8_8_;
        local_178 = (Expression)ZEXT816(0);
        local_d8 = *(undefined1 (*) [16])
                    (*(long *)((long)&(pvVar3->
                                      super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                      )._M_impl.super__Vector_impl_data + lVar9) + 0x70);
        lVar4 = *(long *)((long)&(pvVar3->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar9);
        local_c8 = *(pointer *)(lVar4 + 0x40);
        puStack_c0 = *(pointer *)(lVar4 + 0x48);
        local_b8 = local_158;
        puStack_b0 = puStack_150;
        local_128.i = 3;
        local_128.graph_id = 0;
        local_128.pg = (ComputationGraph *)local_d8;
        local_178 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                              ((initializer_list<dynet::Expression> *)&local_128);
      }
      else {
        local_d8 = *(undefined1 (*) [16])
                    (*(long *)((long)&(pvVar3->
                                      super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                      )._M_impl.super__Vector_impl_data + lVar9) + 0xa0);
        lVar4 = *(long *)((long)&(pvVar3->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar9);
        local_c8 = *(pointer *)(lVar4 + 0x80);
        puStack_c0 = *(pointer *)(lVar4 + 0x88);
        local_b8 = local_158;
        puStack_b0 = puStack_150;
        lVar4 = *(long *)((long)&(pvVar3->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar9);
        local_a8 = *(ExecutionEngine **)(lVar4 + 0x90);
        uStack_a0 = *(undefined8 *)(lVar4 + 0x98);
        local_98 = local_108;
        pCStack_90 = pCStack_100;
        local_148.i = 5;
        local_148.graph_id = 0;
        local_168 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                              ((initializer_list<dynet::Expression> *)&local_148);
        tanh((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        local_d8 = (undefined1  [16])cmult(&local_188,&local_148);
        local_178 = cmult(&local_e8,&local_88);
        EVar12 = operator+(&local_178,(Expression *)local_d8);
        pvVar6 = local_130;
        pEVar5 = local_130[-1].
                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(ComputationGraph **)((long)&pEVar5->pg + lVar10) = EVar12.pg;
        *(long *)((long)&pEVar5->i + lVar10) = EVar12._8_8_;
        local_178 = (Expression)ZEXT816(0);
        local_d8 = *(undefined1 (*) [16])
                    (*(long *)((long)&(pvVar3->
                                      super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                      )._M_impl.super__Vector_impl_data + lVar9) + 0x70);
        lVar4 = *(long *)((long)&(pvVar3->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar9);
        local_c8 = *(pointer *)(lVar4 + 0x40);
        puStack_c0 = *(pointer *)(lVar4 + 0x48);
        local_b8 = local_158;
        puStack_b0 = puStack_150;
        lVar4 = *(long *)((long)&(pvVar3->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar9);
        local_a8 = *(ExecutionEngine **)(lVar4 + 0x50);
        uStack_a0 = *(undefined8 *)(lVar4 + 0x58);
        local_98 = local_108;
        pCStack_90 = pCStack_100;
        local_40._M_len = 5;
        local_40._M_array = (iterator)local_d8;
        local_128 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                              (&local_40);
        local_50 = cmult((Expression *)
                         (*(long *)((long)&(pvVar3->
                                           super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                           )._M_impl.super__Vector_impl_data + lVar9) + 0x60),
                         (Expression *)
                         ((long)&(pvVar6[-1].
                                  super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->pg + lVar10));
        local_178 = operator+(&local_128,&local_50);
      }
      uVar7 = local_f0;
      this = local_138;
      local_d8 = (undefined1  [16])logistic(&local_178);
      tanh((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      EVar12 = cmult((Expression *)local_d8,&local_128);
      pEVar5 = local_f8[-1].
               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(ComputationGraph **)((long)&pEVar5->pg + lVar10) = EVar12.pg;
      *(long *)((long)&pEVar5->i + lVar10) = EVar12._8_8_;
      puVar1 = (undefined8 *)((long)&pEVar5->pg + lVar10);
      local_158 = (ComputationGraph *)*puVar1;
      puStack_150 = (pointer)puVar1[1];
      local_f0 = uVar7 + 1;
      lVar10 = lVar10 + 0x10;
      lVar9 = lVar9 + 0x18;
    } while (local_f0 < this->layers);
  }
  return local_f8[-1].super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1];
}

Assistant:

Expression FastLSTMBuilder::add_input_impl(int prev, const Expression& x) {
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression i_h_tm1, i_c_tm1;
    bool has_prev_state = (prev >= 0 || has_initial_state);
    if (prev < 0) {
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_tm1 = h0[i];
        i_c_tm1 = c0[i];
      }
    } else {  // t > 0
      i_h_tm1 = h[prev][i];
      i_c_tm1 = c[prev][i];
    }
    // input
    Expression i_ait;
    if (has_prev_state) {
//      i_ait = vars[BI] + vars[X2I] * in + vars[H2I]*i_h_tm1 + cmult(vars[C2I], i_c_tm1);
      i_ait = affine_transform({vars[BI], vars[X2I], in, vars[H2I], i_h_tm1}) +
              cmult(vars[C2I], i_c_tm1);
    } else {
//      i_ait = vars[BI] + vars[X2I] * in;
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    }
    Expression i_it = logistic(i_ait);
    // forget
    Expression i_ft = 1.f - i_it;
    // write memory cell
    Expression i_awt;
    if (has_prev_state)
//      i_awt = vars[BC] + vars[X2C] * in + vars[H2C]*i_h_tm1;
      i_awt = affine_transform({vars[BC], vars[X2C], in, vars[H2C], i_h_tm1});
    else
//      i_awt = vars[BC] + vars[X2C] * in;
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);
    // output
    if (has_prev_state) {
      Expression i_nwt = cmult(i_it,i_wt);
      Expression i_crt = cmult(i_ft,i_c_tm1);
      ct[i] = i_crt + i_nwt;
    } else {
      ct[i] = cmult(i_it,i_wt);
    }

    Expression i_aot;
    if (has_prev_state) {
//      i_aot = vars[BO] + vars[X2O] * in + vars[H2O] * i_h_tm1 + cmult(vars[C2O], ct[i]);
      i_aot = affine_transform({vars[BO], vars[X2O], in, vars[H2O], i_h_tm1}) +
              cmult(vars[C2O], ct[i]);
    }
    else {
//      i_aot = vars[BO] + vars[X2O] * in;
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    }
    Expression i_ot = logistic(i_aot);
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cmult(i_ot,ph_t);
  }
  return ht.back();
}